

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_pcm_rb_commit_write(ma_pcm_rb *pRB,ma_uint32 sizeInFrames,void *pBufferOut)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  void *pBufferOut_local;
  ma_uint32 sizeInFrames_local;
  ma_pcm_rb *pRB_local;
  
  if (pRB == (ma_pcm_rb *)0x0) {
    pRB_local._4_4_ = -2;
  }
  else {
    if (pRB == (ma_pcm_rb *)0x0) {
      __assert_fail("pRB != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                    ,0xa6cf,"ma_uint32 ma_pcm_rb_get_bpf(ma_pcm_rb *)");
    }
    mVar1 = pRB->channels;
    mVar2 = ma_get_bytes_per_sample(pRB->format);
    pRB_local._4_4_ = ma_rb_commit_write(&pRB->rb,(ulong)(sizeInFrames * mVar2 * mVar1),pBufferOut);
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_result ma_pcm_rb_commit_write(ma_pcm_rb* pRB, ma_uint32 sizeInFrames, void* pBufferOut)
{
    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    return ma_rb_commit_write(&pRB->rb, sizeInFrames * ma_pcm_rb_get_bpf(pRB), pBufferOut);
}